

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::clear_obj_table(CVmObjTable *this)

{
  CVmObject *pCVar1;
  long in_RDI;
  CVmHashTable *unaff_retaddr;
  CVmObjPageEntry *entry;
  uint j;
  size_t i;
  CVmObjPageEntry *local_20;
  uint local_14;
  ulong local_10;
  
  CVmHashTable::delete_all_entries(unaff_retaddr);
  for (local_10 = 0; local_10 < *(ulong *)(in_RDI + 0x28); local_10 = local_10 + 1) {
    local_14 = 0;
    local_20 = *(CVmObjPageEntry **)(*(long *)(in_RDI + 0x18) + local_10 * 8);
    for (; local_14 < 0x1000; local_14 = local_14 + 1) {
      if ((*(ushort *)&local_20->field_0x14 & 1) == 0) {
        pCVar1 = CVmObjPageEntry::get_vm_obj(local_20);
        (*pCVar1->_vptr_CVmObject[2])(pCVar1,(ulong)(*(ushort *)&local_20->field_0x14 >> 1 & 1));
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void CVmObjTable::clear_obj_table(VMG0_)
{
    /* delete all entries in the post-load initialization table */
    post_load_init_table_->delete_all_entries();

    /* go through the pages and delete the entries */
    for (size_t i = 0 ; i < pages_used_ ; ++i)
    {
        /* delete all of the objects on the page */
        unsigned int j;
		CVmObjPageEntry *entry;
        for (j = 0, entry = pages_[i] ; j < VM_OBJ_PAGE_CNT ; ++j, ++entry)
        {
            /* if this entry is still in use, delete it */
            if (!entry->free_)
                entry->get_vm_obj()->notify_delete(vmg_ entry->in_root_set_);
        }
    }

}